

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

DdNode * CreateTheCodes_rec(DdManager *dd,DdNode *bEncoded,int Level,DdNode **pCVars)

{
  long lVar1;
  int iVar2;
  st__table *table;
  st__generator *gen;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar5;
  ulong uVar6;
  ulong uVar7;
  DdNode *bCode;
  DdNode *bColumn;
  DdNode *local_58;
  DdNode *local_50;
  long local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  if (s_nVarsBest == Level) {
    table = Extra_bddNodePathsUnderCut(dd,bEncoded,s_EncodingVarsLevel);
    gen = st__init_gen(table);
    iVar2 = st__gen(gen,(char **)&local_58,(char **)&local_50);
    if (iVar2 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (local_58 == (DdNode *)((ulong)dd->one ^ 1)) {
          Cudd_RecursiveDeref(dd,local_50);
          Cudd_RecursiveDeref(dd,local_58);
        }
        else {
          s_pbTemp[uVar7] = local_50;
          Cudd_RecursiveDeref(dd,local_58);
          uVar7 = uVar7 + 1;
        }
        iVar2 = st__gen(gen,(char **)&local_58,(char **)&local_50);
      } while (iVar2 != 0);
    }
    st__free_gen(gen);
    st__free_table(table);
    iVar2 = (int)uVar7;
    if (s_MultiStart - Level == 0) {
      if (iVar2 != 1) {
        __assert_fail("nCols == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                      ,0x296,"DdNode *CreateTheCodes_rec(DdManager *, DdNode *, int, DdNode **)");
      }
      pDVar5 = *s_pbTemp;
    }
    else {
      pDVar5 = Extra_bddEncodingBinary(dd,s_pbTemp,iVar2,pCVars + (uint)Level,s_MultiStart - Level);
    }
    Cudd_Ref(pDVar5);
    if (0 < iVar2) {
      uVar6 = 0;
      do {
        Cudd_RecursiveDeref(dd,s_pbTemp[uVar6]);
        uVar6 = uVar6 + 1;
      } while ((uVar7 & 0xffffffff) != uVar6);
    }
  }
  else {
    local_48 = (long)Level;
    pDVar5 = dd->vars[s_VarOrderBest[local_48]];
    local_40 = (DdNode *)((ulong)pDVar5 ^ 1);
    local_38 = pDVar5;
    pDVar3 = Cudd_Cofactor(dd,bEncoded,local_40);
    Cudd_Ref(pDVar3);
    pDVar5 = Cudd_Cofactor(dd,bEncoded,pDVar5);
    Cudd_Ref(pDVar5);
    pDVar4 = CreateTheCodes_rec(dd,pDVar3,Level + 1,pCVars);
    Cudd_Ref(pDVar4);
    n = CreateTheCodes_rec(dd,pDVar5,Level + 1,pCVars);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,pDVar5);
    lVar1 = local_48;
    pDVar5 = Cudd_bddAnd(dd,local_40,(DdNode *)((ulong)pCVars[local_48] ^ 1));
    Cudd_Ref(pDVar5);
    pDVar3 = Cudd_bddAnd(dd,local_38,pCVars[lVar1]);
    Cudd_Ref(pDVar3);
    n_00 = Cudd_bddAnd(dd,pDVar5,pDVar4);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar4 = Cudd_bddAnd(dd,pDVar3,n);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,n);
    pDVar5 = Cudd_bddOr(dd,n_00,pDVar4);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,pDVar4);
  }
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * CreateTheCodes_rec( DdManager * dd, DdNode * bEncoded, int Level, DdNode ** pCVars )
// bEncoded is the preliminarily encoded set of columns
// Level is the current level in the recursion
// pCVars are the variables to be used for encoding
{
    DdNode * bRes;
    if ( Level == s_nVarsBest )
    { // the terminal case, when we need to remap the encoded function 
        // from the preliminary encoded variables to the new ones
        st__table * CutNodes;
        int nCols;
//      double nMints;
/*
#ifdef _DEBUG

        {
        DdNode * bTemp;
        // make sure that the given number of variables is enough
        bTemp  = Cudd_bddExistAbstract( dd, bEncoded, s_VarAll );           Cudd_Ref( bTemp );
//      nMints = Cudd_CountMinterm( dd, bTemp, s_MultiStart );
        nMints = Extra_CountMintermsSimple( bTemp, (1<<s_MultiStart) );
        if ( nMints > Extra_Power2( s_MultiStart-Level ) ) 
        {  // the number of minterms is too large to encode the columns 
           // using the given minimum number of encoding variables
            assert( 0 );
        }
        Cudd_RecursiveDeref( dd, bTemp );
        }
#endif
*/
        // get the columns to be re-encoded
        CutNodes = Extra_bddNodePathsUnderCut( dd, bEncoded, s_EncodingVarsLevel );
        // LUT size is the cut level because because the temporary encoding variables 
        // are above the functional variables - this is not true!!!
        // the temporary variables are below!

        // put the entries from the table into the temporary array
        { 
            st__generator * gen;
            DdNode * bColumn, * bCode;
            nCols = 0;
            st__foreach_item( CutNodes, gen, (const char**)&bCode, (char**)&bColumn )
            {
                if ( bCode == b0 )
                { // the unused part of the columns
                    Cudd_RecursiveDeref( dd, bColumn );
                    Cudd_RecursiveDeref( dd, bCode );
                    continue;
                }
                else
                {
                    s_pbTemp[ nCols ] = bColumn; // takes ref
                    Cudd_RecursiveDeref( dd, bCode );
                    nCols++;
                }
            }
            st__free_table( CutNodes );
//          assert( nCols == (int)nMints );
        }

        // encode the columns
        if ( s_MultiStart-Level == 0 ) // we reached the bottom level of recursion
        {
            assert( nCols       == 1 );
//          assert( (int)nMints == 1 );
            bRes = s_pbTemp[0];     Cudd_Ref( bRes );
        }
        else
        {
            bRes = Extra_bddEncodingBinary( dd, s_pbTemp, nCols, pCVars+Level, s_MultiStart-Level ); Cudd_Ref( bRes );
        }

        // deref the columns
        {
            int i;
            for ( i = 0; i < nCols; i++ )
                Cudd_RecursiveDeref( dd, s_pbTemp[i] );
        }
    }
    else
    {
        // cofactor the problem as specified in the best solution
        DdNode * bCof0,  * bCof1;
        DdNode * bRes0,  * bRes1;
        DdNode * bProd0, * bProd1;
        DdNode * bTemp;
        DdNode * bVarNext = dd->vars[ s_VarOrderBest[Level] ];

        bCof0  = Cudd_Cofactor( dd, bEncoded,  Cudd_Not( bVarNext ) );   Cudd_Ref( bCof0 );
        bCof1  = Cudd_Cofactor( dd, bEncoded,            bVarNext   );   Cudd_Ref( bCof1 );

        // call recursively
        bRes0 = CreateTheCodes_rec( dd, bCof0, Level+1, pCVars );  Cudd_Ref( bRes0 );
        bRes1 = CreateTheCodes_rec( dd, bCof1, Level+1, pCVars );  Cudd_Ref( bRes1 );

        Cudd_RecursiveDeref( dd, bCof0 );
        Cudd_RecursiveDeref( dd, bCof1 );

        // compose the result using the identity (bVarNext <=> pCVars[Level])  - this is wrong!
        // compose the result as follows: x'y'F0 + xyF1
        bProd0 = Cudd_bddAnd( dd, Cudd_Not(bVarNext), Cudd_Not(pCVars[Level]) );   Cudd_Ref( bProd0 );
        bProd1 = Cudd_bddAnd( dd,          bVarNext ,          pCVars[Level]  );   Cudd_Ref( bProd1 );

        bProd0 = Cudd_bddAnd( dd, bTemp = bProd0, bRes0 );   Cudd_Ref( bProd0 );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bRes0 );

        bProd1 = Cudd_bddAnd( dd, bTemp = bProd1, bRes1 );   Cudd_Ref( bProd1 );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bRes1 );

        bRes = Cudd_bddOr( dd, bProd0, bProd1 );             Cudd_Ref( bRes );

        Cudd_RecursiveDeref( dd, bProd0 );
        Cudd_RecursiveDeref( dd, bProd1 );
    }
    Cudd_Deref( bRes );
    return bRes;
}